

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O0

void __thiscall
TPZPrInteg<TPZPrInteg<TPZPrInteg<TPZInt1Point>_>_>::SetOrder
          (TPZPrInteg<TPZPrInteg<TPZPrInteg<TPZInt1Point>_>_> *this,TPZVec<int> *ord,int type)

{
  int64_t iVar1;
  int *piVar2;
  TPZGaussRule *pTVar3;
  undefined4 in_EDX;
  TPZPrInteg<TPZPrInteg<TPZInt1Point>_> *in_RSI;
  long in_RDI;
  int in_stack_00000028;
  int in_stack_0000002c;
  TPZIntRuleList *in_stack_00000030;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar1 = TPZVec<int>::NElements((TPZVec<int> *)in_RSI);
  if (iVar1 < 3) {
    std::operator<<((ostream *)&std::cout,
                    "TPZPrInteg::SetOrder: number of integration points specified smaller than dimension\n"
                   );
  }
  else {
    TPZPrInteg<TPZPrInteg<TPZInt1Point>_>::SetOrder
              (in_RSI,(TPZVec<int> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
               (int)((ulong)in_RDI >> 0x20));
    piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)in_RSI,2);
    *(int *)(in_RDI + 0x28) = *piVar2;
    TPZVec<int>::operator[]((TPZVec<int> *)in_RSI,2);
    pTVar3 = TPZIntRuleList::GetRule(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
    *(TPZGaussRule **)(in_RDI + 0x30) = pTVar3;
  }
  return;
}

Assistant:

void SetOrder(TPZVec<int> &ord, int type = 0) override
    {
#ifndef PZNODEBUG
		if(ord.NElements() < Dim) {
			std::cout << "TPZPrInteg::SetOrder: number of integration points specified smaller than dimension\n";
			return;
		}
#endif
		TFather::SetOrder(ord,type);
		fOrdKsi = ord[Dim-1];
		fIntP   = TPZIntRuleList::gIntRuleList.GetRule(ord[Dim-1]);
    }